

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

predict_type
recall_tree_ns::predict_from(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  uint64_t *puVar1;
  float fVar2;
  label_t lVar3;
  node *pnVar4;
  bool bVar5;
  uint32_t uVar6;
  predict_type pVar7;
  uint cn_00;
  
  lVar3 = (ec->l).multi;
  fVar2 = (ec->pred).scalar;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  do {
    cn_00 = cn;
    pnVar4 = (b->nodes)._begin;
    if (pnVar4[cn_00].internal != true) break;
    uVar6 = pnVar4[cn_00].base_router;
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar6);
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uVar6 * *(int *)(base + 0xe0));
    pnVar4 = (b->nodes)._begin;
    if (b->bern_hyper <= 0.0) {
      bVar5 = false;
    }
    else {
      bVar5 = pnVar4[(&pnVar4[cn_00].left)
                     [0.0 < ec->partial_prediction || ec->partial_prediction == 0.0]].recall_lbest
              <= pnVar4[cn_00].recall_lbest;
    }
    cn = (&pnVar4[cn_00].left)[0.0 < ec->partial_prediction || ec->partial_prediction == 0.0];
  } while (!bVar5);
  (ec->l).multi = lVar3;
  (ec->pred).scalar = fVar2;
  uVar6 = oas_predict(b,base,cn_00,ec);
  pVar7.class_prediction = uVar6;
  pVar7.node_id = cn_00;
  return pVar7;
}

Assistant:

predict_type predict_from(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_router);
    uint32_t newcn = descend(b.nodes[cn], ec.partial_prediction);
    bool cond = stop_recurse_check(b, cn, newcn);

    if (cond)
      break;

    cn = newcn;
  }

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return predict_type(cn, oas_predict(b, base, cn, ec));
}